

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_fixed_suite::fixed_assign_iterator(void)

{
  basic_iterator<int> first_end;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<int> first_begin;
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> expect;
  undefined8 local_78;
  undefined8 uStack_70;
  vector<int,_std::allocator<int>_> input;
  circular_view<int,_4UL> span;
  int array [4];
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.size = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&expect;
  std::vector<int,_std::allocator<int>_>::vector(&input,__l,(allocator_type *)&local_78);
  vista::circular_view<int,4ul>::
  assign<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&span,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  local_78 = 0x160000000b;
  uStack_70 = 0x2c00000021;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_78;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_a9);
  first_begin.current._0_4_ = (uint)span.member.next - (int)span.member.size & 7;
  first_end.current._0_4_ = (uint)span.member.next & 7;
  first_end.parent = &span;
  first_end.current._4_4_ = 0;
  first_begin.parent = &span;
  first_begin.current._4_4_ = 0;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x3ab,"void api_fixed_suite::fixed_assign_iterator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void fixed_assign_iterator()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    std::vector<int> input = {11, 22, 33, 44};
    span.assign(input.begin(), input.end());
    {
        std::vector<int> expect = {11, 22, 33, 44};
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}